

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_ecdsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EC_KEY *ec_ctx;
  libssh2_curve_type lVar1;
  int iVar2;
  unsigned_long hash_len;
  long lVar3;
  EVP_MD_CTX *ctx;
  uchar hash [32];
  EVP_MD_CTX *local_88;
  size_t *local_80;
  uchar local_78 [72];
  
  ec_ctx = (EC_KEY *)*abstract;
  lVar1 = _libssh2_ecdsa_get_curve_type(ec_ctx);
  local_80 = signature_len;
  if (lVar1 == LIBSSH2_EC_CURVE_NISTP521) {
    _libssh2_sha512_init((EVP_MD_CTX **)&local_88);
    if (0 < veccount) {
      lVar3 = 0;
      do {
        EVP_DigestUpdate(local_88,*(void **)((long)&datavec->iov_base + lVar3),
                         *(size_t *)((long)&datavec->iov_len + lVar3));
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar3);
    }
    EVP_DigestFinal(local_88,local_78,(uint *)0x0);
    EVP_MD_CTX_free(local_88);
    hash_len = 0x40;
  }
  else if (lVar1 == LIBSSH2_EC_CURVE_NISTP384) {
    _libssh2_sha384_init((EVP_MD_CTX **)&local_88);
    if (0 < veccount) {
      lVar3 = 0;
      do {
        EVP_DigestUpdate(local_88,*(void **)((long)&datavec->iov_base + lVar3),
                         *(size_t *)((long)&datavec->iov_len + lVar3));
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar3);
    }
    EVP_DigestFinal(local_88,local_78,(uint *)0x0);
    EVP_MD_CTX_free(local_88);
    hash_len = 0x30;
  }
  else {
    if (lVar1 != LIBSSH2_EC_CURVE_NISTP256) {
      return -1;
    }
    _libssh2_sha256_init((EVP_MD_CTX **)&local_88);
    if (0 < veccount) {
      lVar3 = 0;
      do {
        EVP_DigestUpdate(local_88,*(void **)((long)&datavec->iov_base + lVar3),
                         *(size_t *)((long)&datavec->iov_len + lVar3));
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar3);
    }
    EVP_DigestFinal(local_88,local_78,(uint *)0x0);
    EVP_MD_CTX_free(local_88);
    hash_len = 0x20;
  }
  iVar2 = _libssh2_ecdsa_sign(session,ec_ctx,local_78,hash_len,signature,local_80);
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_signv(LIBSSH2_SESSION * session,
                               unsigned char **signature,
                               size_t *signature_len,
                               int veccount,
                               const struct iovec datavec[],
                               void **abstract)
{
    libssh2_ecdsa_ctx *ec_ctx = (libssh2_ecdsa_ctx *) (*abstract);
    libssh2_curve_type type = _libssh2_ecdsa_get_curve_type(ec_ctx);
    int ret = 0;

    if(type == LIBSSH2_EC_CURVE_NISTP256) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(256);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(384);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(512);
    }
    else {
        return -1;
    }

    return ret;
}